

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::extract_struct_info_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference ppPVar4;
  vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  remove_reference_t<unsigned_int_&> *args_00;
  char (*format_str) [9];
  char (*format_str_00) [8];
  char (*format_str_01) [9];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_498;
  undefined1 local_440 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  allocator<char> local_379;
  string local_378 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  undefined1 local_348 [8];
  string entry_str;
  string local_320;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2fb;
  undefined1 local_2fa;
  allocator<char> local_2f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  iterator local_2d0;
  size_type local_2c8;
  undefined1 local_2c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  PackedStructFieldDef *def;
  const_iterator __end2;
  const_iterator __begin2;
  vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *__range2;
  string entry;
  PackedStruct *struct_;
  undefined1 local_258 [4];
  uint32_t i;
  vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> structs;
  undefined1 local_230 [8];
  PortPackedVisitor visitor;
  Generator *top_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *result;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_170;
  basic_string_view<char> local_168;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_158;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int>
  *vargs;
  char *local_138;
  string *local_130;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_128;
  basic_string_view<char> local_118;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_108;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_e8;
  undefined1 *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int>
  *vargs_2;
  char *local_90;
  undefined1 *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  PortPackedVisitor::PortPackedVisitor((PortPackedVisitor *)local_230);
  IRVisitor::visit_generator_root
            ((IRVisitor *)local_230,
             (Generator *)visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  structs.
  super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  PortPackedVisitor::structs
            ((vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> *)
             local_258,(PortPackedVisitor *)local_230);
  struct_._4_4_ = 0;
  while( true ) {
    uVar2 = (ulong)struct_._4_4_;
    sVar3 = std::vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
            ::size((vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                    *)local_258);
    if (sVar3 <= uVar2) break;
    ppPVar4 = std::
              vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>::
              operator[]((vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                          *)local_258,(ulong)struct_._4_4_);
    entry.field_2._8_8_ = *ppPVar4;
    std::__cxx11::string::string((string *)&__range2);
    std::__cxx11::string::append((char *)&__range2);
    this_00 = (vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *
              )(entry.field_2._8_8_ + 0x20);
    __end2 = std::
             vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
             begin(this_00);
    def = (PackedStructFieldDef *)
          std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
          end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                                  *)&def);
      if (!bVar1) break;
      str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           &__gnu_cxx::
            __normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
            ::operator*(&__end2)->name;
      if (((reference)
          str.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->struct_ == (PackedStruct *)0x0) {
        local_2fa = 1;
        local_2f8 = &local_2f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,"    logic",&local_2f9);
        local_2fa = 0;
        local_2d0 = &local_2f0;
        local_2c8 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_2fb);
        __l._M_len = local_2c8;
        __l._M_array = local_2d0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2c0,__l,&local_2fb);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_2fb);
        args = &local_2f0;
        local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d0;
        do {
          local_498 = local_498 + -1;
          std::__cxx11::string::~string((string *)local_498);
        } while (local_498 != args);
        std::allocator<char>::~allocator(&local_2f9);
        if (1 < *(uint *)(str.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
          entry_str.field_2._12_4_ =
               *(int *)(str.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) + -1;
          local_130 = &local_320;
          local_138 = "[{0}:0]";
          vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int>
                   *)((long)&entry_str.field_2 + 0xc);
          local_158.named_args.data =
               (named_arg_info<char> *)
               fmt::v7::make_args_checked<unsigned_int,char[8],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int>
                           *)"[{0}:0]",(v7 *)vargs,format_str_00,
                          (remove_reference_t<unsigned_int> *)args);
          local_148 = &local_158;
          bVar5 = fmt::v7::to_string_view<char,_0>(local_138);
          local_40 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&result;
          local_48 = local_148;
          local_38 = local_148;
          local_28 = local_148;
          local_30 = local_40;
          local_168 = bVar5;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_40,2,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)&local_148->string);
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_170.values_;
          format_str_02.size_ = (size_t)result;
          format_str_02.data_ = (char *)local_168.size_;
          in_R8 = local_170;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_320,(detail *)local_168.data_,format_str_02,args_01);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2c0,
                     &local_320);
          std::__cxx11::string::~string((string *)&local_320);
        }
        if ((str.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage[1].field_0x4 & 1) != 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[7]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2c0,
                     (char (*) [7])0x428fa0);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2c0,
                   str.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2c0);
        local_358._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2c0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_378," ",&local_379);
        string::
        join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((string *)local_348,(string *)local_350,local_358,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                   (string *)in_R8.values_);
        std::__cxx11::string::~string(local_378);
        std::allocator<char>::~allocator(&local_379);
        std::operator+(&local_3a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_348,";\n");
        std::__cxx11::string::append((string *)&__range2);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)local_348);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2c0);
      }
      else {
        std::operator+(&local_400,
                       &((reference)
                        str.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->struct_->struct_name,
                       " ");
        std::operator+(&local_3e0,&local_400,
                       str.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_3c0,&local_3e0,";\n");
        std::__cxx11::string::append((string *)&__range2);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_400);
      }
      __gnu_cxx::
      __normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
      ::operator++(&__end2);
    }
    local_e0 = (undefined1 *)((long)&name.field_2 + 8);
    local_e8 = "}} {0};\n";
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)entry.field_2._8_8_;
    local_108.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[9],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"}} {0};\n",(v7 *)entry.field_2._8_8_,format_str,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)"}} {0};\n");
    local_f8 = &local_108;
    bVar5 = fmt::v7::to_string_view<char,_0>(local_e8);
    local_78 = &local_128;
    local_80 = local_f8;
    local_70 = local_f8;
    local_60 = local_f8;
    local_68 = local_78;
    local_118 = bVar5;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_78,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_f8->string);
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_128.field_1.values_;
    format_str_03.size_ = local_128.desc_;
    format_str_03.data_ = (char *)local_118.size_;
    args_00 = (remove_reference_t<unsigned_int_&> *)local_128.desc_;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&name.field_2 + 8),(detail *)local_118.data_,format_str_03,args_02);
    std::__cxx11::string::append((string *)&__range2);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    local_88 = local_440;
    local_90 = "{0:032d}";
    vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int>
               *)((long)&struct_ + 4);
    local_b8.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<unsigned_int&,char[9],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int>
                     *)"{0:032d}",(v7 *)vargs_2,format_str_01,args_00);
    local_a0 = &local_b8;
    bVar5 = fmt::v7::to_string_view<char,_0>(local_90);
    local_50 = &local_d8;
    local_58 = local_a0;
    local_20 = local_a0;
    local_10 = local_a0;
    local_18 = local_50;
    local_c8 = bVar5;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,2,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_a0->string);
    args_03.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_03.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_d8.field_1.values_;
    format_str_04.size_ = local_d8.desc_;
    format_str_04.data_ = (char *)local_c8.size_;
    in_R8 = local_d8.field_1;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_440,(detail *)local_c8.data_,format_str_04,args_03);
    std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<std::__cxx11::string&,std::__cxx11::string&>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
    std::__cxx11::string::~string((string *)local_440);
    std::__cxx11::string::~string((string *)&__range2);
    struct_._4_4_ = struct_._4_4_ + 1;
  }
  structs.
  super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  std::vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>::~vector
            ((vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> *)
             local_258);
  if ((structs.
       super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(__return_storage_ptr__);
  }
  PortPackedVisitor::~PortPackedVisitor((PortPackedVisitor *)local_230);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> extract_struct_info(Generator* top) {
    PortPackedVisitor visitor;
    visitor.visit_generator_root(top);

    // convert the definition into
    std::map<std::string, std::string> result;
    auto const structs = visitor.structs();
    for (uint32_t i = 0; i < structs.size(); i++) {
        auto const* struct_ = structs[i];
        // TODO:
        //  Use Stream class in the codegen instead to track the debugging info
        //  Share the same code gen logic with Stream
        std::string entry;
        entry.append("typedef struct packed {\n");

        for (auto const& def : struct_->attributes) {
            if (!def.struct_) {
                std::vector<std::string> str = {"    logic"};
                if (def.width > 1) str.emplace_back(::format("[{0}:0]", def.width - 1));
                if (def.signed_) str.emplace_back("signed");
                str.emplace_back(def.name);
                auto entry_str = string::join(str.begin(), str.end(), " ");
                entry.append(entry_str + ";\n");
            } else {
                entry.append(def.struct_->struct_name + " " + def.name + ";\n");
            }
        }
        entry.append(::format("}} {0};\n", struct_->struct_name));
        // this is a hack to ensure ordering. refactoring this requires refactoring
        // code from the caller site
        auto name = fmt::format("{0:032d}", i);
        result.emplace(name, entry);
    }
    return result;
}